

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

LayoutBindingTestResult * __thiscall
glcts::AtomicCounterLayoutBindingCase::binding_mixed_order
          (LayoutBindingTestResult *__return_storage_ptr__,AtomicCounterLayoutBindingCase *this)

{
  IProgramContextSupplier *pIVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LayoutBindingProgram *pLVar5;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  allocator<char> local_30c;
  allocator<char> local_30b;
  allocator<char> local_30a;
  allocator<char> local_309;
  String decl;
  String local_2e8;
  string local_2c8 [32];
  String local_2a8;
  String local_288;
  String local_268;
  String local_248;
  String local_228;
  String local_208;
  String local_1e8;
  String local_1c8;
  StringStream s;
  undefined4 extraout_var_01;
  
  StringStream::StringStream(&s);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(&local_2e8,this,0);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x1b])(&decl,this,&local_2e8);
  poVar4 = std::operator<<((ostream *)&s,(string *)&decl);
  std::operator<<(poVar4,";\n");
  std::__cxx11::string::~string((string *)&decl);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::stringbuf::str();
  LayoutBindingBaseCase::setTemplateParam(&this->super_LayoutBindingBaseCase,"UNIFORM_ACCESS",&decl)
  ;
  std::__cxx11::string::~string((string *)&decl);
  iVar3 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x13])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,*(char **)CONCAT44(extraout_var,iVar3),&local_30a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"layout(binding=0, offset=0)",&local_30b);
  iVar3 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[0x13])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,*(char **)(CONCAT44(extraout_var_00,iVar3) + 0x18),&local_30c);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(&local_208,this,0);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x1c])(&local_2a8,this,&local_208);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(local_2c8,this,0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"float",&local_309);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x1d])(&local_228,this,local_2c8,&local_248);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(&local_1e8,this,0);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  LayoutBindingBaseCase::buildUniformDecl
            (&decl,&this->super_LayoutBindingBaseCase,&local_2e8,&local_268,&local_288,&local_2a8,
             &local_228,&local_1e8,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_2e8);
  LayoutBindingBaseCase::setTemplateParam(&this->super_LayoutBindingBaseCase,"UNIFORM_DECL",&decl);
  LayoutBindingBaseCase::updateTemplate(&this->super_LayoutBindingBaseCase);
  pIVar1 = &(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier;
  iVar3 = (*(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier.
            _vptr_IProgramContextSupplier[6])(pIVar1);
  pLVar5 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar3);
  bVar2 = LayoutBindingProgram::compiledAndLinked(pLVar5);
  if (bVar2) {
    (*pLVar5->_vptr_LayoutBindingProgram[1])(pLVar5);
    std::__cxx11::string::~string((string *)&decl);
    StringStream::~StringStream(&s);
    iVar3 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&decl,*(char **)CONCAT44(extraout_var_02,iVar3),
               (allocator<char> *)&local_1c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,"layout(offset=0, binding=0)",&local_30a);
    iVar3 = (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,*(char **)(CONCAT44(extraout_var_03,iVar3) + 0x18),&local_30b);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(&local_2a8,this,0);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1c])(&local_288,this,&local_2a8);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(&local_228,this,0);
    std::__cxx11::string::string<std::allocator<char>>(local_2c8,"float",&local_30c);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x1d])(&local_208,this,&local_228,local_2c8);
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(&local_248,this,0);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    LayoutBindingBaseCase::buildUniformDecl
              ((String *)&s,&this->super_LayoutBindingBaseCase,&decl,&local_2e8,&local_268,
               &local_288,&local_208,&local_248,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&decl);
    LayoutBindingBaseCase::setTemplateParam
              (&this->super_LayoutBindingBaseCase,"UNIFORM_DECL",(String *)&s);
    LayoutBindingBaseCase::updateTemplate(&this->super_LayoutBindingBaseCase);
    iVar3 = (*pIVar1->_vptr_IProgramContextSupplier[6])(pIVar1);
    pLVar5 = (LayoutBindingProgram *)CONCAT44(extraout_var_04,iVar3);
    bVar2 = LayoutBindingProgram::compiledAndLinked(pLVar5);
    if (bVar2) {
      (*pLVar5->_vptr_LayoutBindingProgram[1])(pLVar5);
      std::__cxx11::string::~string((string *)&s);
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
      __return_storage_ptr__->m_passed = true;
      __return_storage_ptr__->m_notRunForThisContext = false;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->m_reason,(string *)&s);
    }
    else {
      LayoutBindingProgram::getErrorLog_abi_cxx11_(&decl,pLVar5,false);
      __return_storage_ptr__->m_passed = false;
      __return_storage_ptr__->m_notRunForThisContext = false;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->m_reason,(string *)&decl);
      std::__cxx11::string::~string((string *)&decl);
      (*pLVar5->_vptr_LayoutBindingProgram[1])(pLVar5);
    }
    std::__cxx11::string::~string((string *)&s);
  }
  else {
    LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_2e8,pLVar5,false);
    __return_storage_ptr__->m_passed = false;
    __return_storage_ptr__->m_notRunForThisContext = false;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->m_reason,(string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    (*pLVar5->_vptr_LayoutBindingProgram[1])(pLVar5);
    std::__cxx11::string::~string((string *)&decl);
    StringStream::~StringStream(&s);
  }
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult binding_mixed_order(void)
	{
		bool passed = true;

		{
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			String decl =
				buildUniformDecl(String(getTestParameters().keyword), String("layout(binding=0, offset=0)"),
								 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								 buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
			setTemplateParam("UNIFORM_DECL", decl);
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}
		}
		{
			String decl =
				buildUniformDecl(String(getTestParameters().keyword), String("layout(offset=0, binding=0)"),
								 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								 buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
			setTemplateParam("UNIFORM_DECL", decl);
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}
		}

		return true;
	}